

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publish(Publication *this,char val)

{
  string_view val_00;
  long in_RDI;
  int64_t in_stack_00000078;
  Publication *in_stack_00000080;
  Publication *in_stack_000000d0;
  undefined7 in_stack_000000d8;
  bool in_stack_000000df;
  Publication *in_stack_000000e0;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  char local_9 [9];
  
  switch(*(undefined4 *)(in_RDI + 0x58)) {
  case 0:
  case 6:
  case 9:
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_20,local_9,1);
    val_00._M_len._7_1_ = in_stack_000000df;
    val_00._M_len._0_7_ = in_stack_000000d8;
    val_00._M_str = (char *)in_stack_000000e0;
    publishString(in_stack_000000d0,val_00);
    break;
  default:
    publishInt(in_stack_00000080,in_stack_00000078);
    break;
  case 7:
    publish(in_stack_000000e0,in_stack_000000df);
  }
  return;
}

Assistant:

void Publication::publish(char val)
{
    switch (pubType) {
        case DataType::HELICS_BOOL:
            publish(!((val == '0') || (val == 'f') || (val == 0) || (val == 'F') || (val == '-')));
            break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_NAMED_POINT:
        case DataType::HELICS_CHAR:
            publishString({&val, 1});
            break;
        default:
            publishInt(static_cast<int64_t>(val));
    }
}